

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::
TextureBorderClampPerAxisCase3D
          (TextureBorderClampPerAxisCase3D *this,Context *context,char *name,char *description,
          deUint32 texFormat,SizeType size,deUint32 filter,deUint32 sWrap,deUint32 tWrap,
          deUint32 rWrap)

{
  TextureChannelClass TVar1;
  SizeType size_local;
  deUint32 texFormat_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  TextureBorderClampPerAxisCase3D *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureBorderClampPerAxisCase3D_032b6978;
  this->m_texFormat = texFormat;
  TVar1 = getFormatChannelClass(texFormat,MODE_LAST);
  this->m_channelClass = TVar1;
  if (size == SIZE_POT) {
    tcu::Vector<int,_3>::Vector(&this->m_size,8,0x10,4);
  }
  else {
    tcu::Vector<int,_3>::Vector(&this->m_size,0xd,5,7);
  }
  this->m_filter = filter;
  this->m_sWrap = sWrap;
  this->m_tWrap = tWrap;
  this->m_rWrap = rWrap;
  de::details::MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::MovePtr
            (&this->m_texture);
  de::details::
  MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  ::MovePtr(&this->m_renderer);
  rr::GenericVec4::GenericVec4(&this->m_borderColor);
  std::vector<float,_std::allocator<float>_>::vector(&this->m_texCoords);
  tcu::Vector<float,_4>::Vector(&this->m_lookupScale);
  tcu::Vector<float,_4>::Vector(&this->m_lookupBias);
  return;
}

Assistant:

TextureBorderClampPerAxisCase3D::TextureBorderClampPerAxisCase3D (Context&		context,
																  const char*	name,
																  const char*	description,
																  deUint32		texFormat,
																  SizeType		size,
																  deUint32		filter,
																  deUint32		sWrap,
																  deUint32		tWrap,
																  deUint32		rWrap)
	: TestCase			(context, name, description)
	, m_texFormat		(texFormat)
	, m_channelClass	(getFormatChannelClass(texFormat, tcu::Sampler::MODE_LAST))
	, m_size			((size == SIZE_POT) ? (tcu::IVec3(8, 16, 4)) : (tcu::IVec3(13, 5, 7)))
	, m_filter			(filter)
	, m_sWrap			(sWrap)
	, m_tWrap			(tWrap)
	, m_rWrap			(rWrap)
{
}